

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fake_network.cxx
# Opt level: O2

ptr<rpc_client> __thiscall nuraft::FakeNetwork::create_client(FakeNetwork *this,string *endpoint)

{
  string *this_00;
  iterator __position;
  __shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2> *this_01;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ptr<rpc_client> pVar2;
  ptr<FakeClient> ret;
  FakeNetwork *dst_net;
  __shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2> local_58;
  FakeNetwork *local_40;
  FakeNetwork *local_38;
  
  local_40 = FakeNetworkBase::findNetwork((FakeNetworkBase *)endpoint[2]._M_dataplus._M_p,in_RDX);
  if (local_40 == (FakeNetwork *)0x0) {
    (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)0x0;
    (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)0x0;
    _Var1._M_pi = extraout_RDX;
  }
  else {
    std::mutex::lock((mutex *)&endpoint[4].field_2);
    this_00 = endpoint + 3;
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                         *)this_00,in_RDX);
    if (__position._M_node != (_Base_ptr)&endpoint[3]._M_string_length) {
      std::__cxx11::
      list<std::shared_ptr<nuraft::FakeClient>,_std::allocator<std::shared_ptr<nuraft::FakeClient>_>_>
      ::push_back((list<std::shared_ptr<nuraft::FakeClient>,_std::allocator<std::shared_ptr<nuraft::FakeClient>_>_>
                   *)((long)&endpoint[5].field_2 + 8),(value_type *)(__position._M_node + 2));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<nuraft::FakeClient>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<nuraft::FakeClient>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<nuraft::FakeClient>>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<nuraft::FakeClient>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<nuraft::FakeClient>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<nuraft::FakeClient>>>>
                          *)this_00,__position);
    }
    local_38 = (FakeNetwork *)endpoint;
    std::make_shared<nuraft::FakeClient,nuraft::FakeNetwork*,nuraft::FakeNetwork*&>
              ((FakeNetwork **)&local_58,&local_38);
    this_01 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<nuraft::FakeClient>_>_>_>
                             *)this_00,in_RDX)->
               super___shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<nuraft::FakeClient,_(__gnu_cxx::_Lock_policy)2>::operator=(this_01,&local_58);
    _Var1._M_pi = local_58._M_refcount._M_pi;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_rpc_client_factory)._vptr_rpc_client_factory = (_func_int **)local_58._M_ptr;
    (this->super_rpc_listener)._vptr_rpc_listener = (_func_int **)_Var1._M_pi;
    local_58._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)&endpoint[4].field_2);
    _Var1._M_pi = extraout_RDX_00;
  }
  pVar2.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  pVar2.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<rpc_client>)pVar2.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<rpc_client> FakeNetwork::create_client(const std::string& endpoint) {
    FakeNetwork* dst_net = base->findNetwork(endpoint);
    if (!dst_net) return nullptr;

    std::lock_guard<std::mutex> ll(clientsLock);
    auto entry = clients.find(endpoint);
    if (entry != clients.end()) {
        // Already exists, move it to garbage list as it will be
        // replaced below.
        staleClients.push_back(entry->second);
        clients.erase(entry);
    }

    ptr<FakeClient> ret = cs_new<FakeClient>(this, dst_net);
    clients[endpoint] = ret;
    return ret;
}